

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::BufferGLImpl::CreateViewInternal
          (BufferGLImpl *this,BufferViewDesc *OrigViewDesc,IBufferView **ppView,bool bIsDefaultView)

{
  RenderDeviceGLImpl *Ctx;
  BufferViewGLImpl *pBVar1;
  FixedBlockMemoryAllocator *pFVar2;
  bool bIsDefaultView_local;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pContext;
  string msg;
  RenderDeviceGLImpl *pDeviceGLImpl;
  BufferGLImpl *local_60;
  BufferViewDesc ViewDesc;
  
  bIsDefaultView_local = bIsDefaultView;
  if (ppView == (IBufferView **)0x0) {
    FormatString<char[36]>(&msg,(char (*) [36])"Buffer view pointer address is null");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
               ,399);
    std::__cxx11::string::~string((string *)&msg);
  }
  else {
    if (*ppView != (IBufferView *)0x0) {
      FormatString<char[64]>
                (&msg,(char (*) [64])
                      "Overwriting reference to existing object may cause memory leaks");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x191);
      std::__cxx11::string::~string((string *)&msg);
    }
    *ppView = (IBufferView *)0x0;
    Ctx = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
          ::GetDevice((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                       *)this);
    ViewDesc.super_DeviceObjectAttribs.Name = (OrigViewDesc->super_DeviceObjectAttribs).Name;
    ViewDesc.ViewType = OrigViewDesc->ViewType;
    ViewDesc.Format = OrigViewDesc->Format;
    ViewDesc._12_4_ = *(undefined4 *)&OrigViewDesc->field_0xc;
    ViewDesc.ByteOffset = OrigViewDesc->ByteOffset;
    ViewDesc.ByteWidth = OrigViewDesc->ByteWidth;
    pDeviceGLImpl = Ctx;
    ValidateAndCorrectBufferViewDesc
              (&(this->super_BufferBase<Diligent::EngineGLImplTraits>).
                super_DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                .m_Desc,&ViewDesc,
               (Ctx->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_AdapterInfo.Buffer.
               StructuredBufferOffsetAlignment);
    pFVar2 = &(Ctx->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_BuffViewObjAllocator;
    if (pFVar2 != (this->super_BufferBase<Diligent::EngineGLImplTraits>).m_dbgBuffViewAllocator) {
      FormatString<char[79]>
                (&msg,(char (*) [79])
                      "Buff view allocator does not match allocator provided at buffer initialization"
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x19d);
      std::__cxx11::string::~string((string *)&msg);
    }
    RenderDeviceBase<Diligent::EngineGLImplTraits>::GetImmediateContext
              ((RenderDeviceBase<Diligent::EngineGLImplTraits> *)&pContext,(size_t)Ctx);
    if (pContext.m_pObject == (DeviceContextGLImpl *)0x0) {
      FormatString<char[36]>(&msg,(char (*) [36])"Immediate context has been released");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
                 ,0x1a0);
      std::__cxx11::string::~string((string *)&msg);
    }
    msg._M_string_length = (size_type)(BufferGLImpl *)0x0;
    if (bIsDefaultView) {
      msg._M_string_length = (size_type)this;
    }
    msg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_5bd7;
    msg.field_2._8_8_ = anon_var_dwarf_5a32;
    msg._M_dataplus._M_p = (pointer)pFVar2;
    local_60 = this;
    pBVar1 = MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
             operator()((MakeNewRCObj<Diligent::BufferViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                         *)&msg,&pDeviceGLImpl,&(pContext.m_pObject)->m_ContextState,&ViewDesc,
                        &local_60,&bIsDefaultView_local);
    *ppView = (IBufferView *)pBVar1;
    if (bIsDefaultView_local == false) {
      (**(code **)((long)(pBVar1->super_BufferViewBase<Diligent::EngineGLImplTraits>).
                         super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
                         .super_ObjectBase<Diligent::IBufferViewGL>.
                         super_RefCountedObject<Diligent::IBufferViewGL>.super_IBufferViewGL.
                         super_IBufferView.super_IDeviceObject + 8))(pBVar1);
    }
    RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release(&pContext);
  }
  return;
}

Assistant:

void BufferGLImpl::CreateViewInternal(const BufferViewDesc& OrigViewDesc, IBufferView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "Buffer view pointer address is null");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        auto* const pDeviceGLImpl = GetDevice();

        auto ViewDesc = OrigViewDesc;
        ValidateAndCorrectBufferViewDesc(m_Desc, ViewDesc, pDeviceGLImpl->GetAdapterInfo().Buffer.StructuredBufferOffsetAlignment);

        auto& BuffViewAllocator = pDeviceGLImpl->GetBuffViewObjAllocator();
        VERIFY(&BuffViewAllocator == &m_dbgBuffViewAllocator, "Buff view allocator does not match allocator provided at buffer initialization");

        auto pContext = pDeviceGLImpl->GetImmediateContext(0);
        VERIFY(pContext, "Immediate context has been released");
        auto& CtxState = pContext->GetContextState();

        *ppView = NEW_RC_OBJ(BuffViewAllocator, "BufferViewGLImpl instance", BufferViewGLImpl, bIsDefaultView ? this : nullptr)(pDeviceGLImpl, CtxState, ViewDesc, this, bIsDefaultView);

        if (!bIsDefaultView)
            (*ppView)->AddRef();
    }
    catch (const std::runtime_error&)
    {
        const auto* ViewTypeName = GetBufferViewTypeLiteralName(OrigViewDesc.ViewType);
        LOG_ERROR("Failed to create view '", (OrigViewDesc.Name ? OrigViewDesc.Name : ""), "' (", ViewTypeName, ") for buffer '", (m_Desc.Name ? m_Desc.Name : ""), "'");
    }
}